

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Chacha20.c
# Opt level: O0

void Hacl_Impl_Chacha20_chacha20_init(uint32_t *ctx,uint8_t *k,uint8_t *n,uint32_t ctr)

{
  uint32_t uVar1;
  __uint32_t _Var2;
  uint32_t x_14;
  uint32_t r_10;
  uint32_t u_10;
  uint8_t *bj_10;
  uint32_t *os_14;
  uint32_t x_13;
  uint32_t r_9;
  uint32_t u_9;
  uint8_t *bj_9;
  uint32_t *os_13;
  uint32_t x_12;
  uint32_t r_8;
  uint32_t u_8;
  uint8_t *bj_8;
  uint32_t *os_12;
  uint32_t i_2;
  uint32_t x_11;
  uint32_t r_7;
  uint32_t u_7;
  uint8_t *bj_7;
  uint32_t *os_11;
  uint32_t x_10;
  uint32_t r_6;
  uint32_t u_6;
  uint8_t *bj_6;
  uint32_t *os_10;
  uint32_t x_9;
  uint32_t r_5;
  uint32_t u_5;
  uint8_t *bj_5;
  uint32_t *os_9;
  uint32_t x_8;
  uint32_t r_4;
  uint32_t u_4;
  uint8_t *bj_4;
  uint32_t *os_8;
  uint32_t x_7;
  uint32_t r_3;
  uint32_t u_3;
  uint8_t *bj_3;
  uint32_t *os_7;
  uint32_t x_6;
  uint32_t r_2;
  uint32_t u_2;
  uint8_t *bj_2;
  uint32_t *os_6;
  uint32_t x_5;
  uint32_t r_1;
  uint32_t u_1;
  uint8_t *bj_1;
  uint32_t *os_5;
  uint32_t x_4;
  uint32_t r;
  uint32_t u;
  uint8_t *bj;
  uint32_t *os_4;
  uint32_t i_1;
  uint32_t x_3;
  uint32_t *os_3;
  uint32_t x_2;
  uint32_t *os_2;
  uint32_t x_1;
  uint32_t *os_1;
  uint32_t x;
  uint32_t *os;
  uint32_t i;
  uint32_t ctr_local;
  uint8_t *n_local;
  uint8_t *k_local;
  uint32_t *ctx_local;
  
  *ctx = 0x61707865;
  ctx[1] = 0x3320646e;
  ctx[2] = 0x79622d32;
  ctx[3] = 0x6b206574;
  uVar1 = load32(k);
  _Var2 = __uint32_identity(uVar1);
  ctx[4] = _Var2;
  uVar1 = load32(k + 4);
  _Var2 = __uint32_identity(uVar1);
  ctx[5] = _Var2;
  uVar1 = load32(k + 8);
  _Var2 = __uint32_identity(uVar1);
  ctx[6] = _Var2;
  uVar1 = load32(k + 0xc);
  _Var2 = __uint32_identity(uVar1);
  ctx[7] = _Var2;
  uVar1 = load32(k + 0x10);
  _Var2 = __uint32_identity(uVar1);
  ctx[8] = _Var2;
  uVar1 = load32(k + 0x14);
  _Var2 = __uint32_identity(uVar1);
  ctx[9] = _Var2;
  uVar1 = load32(k + 0x18);
  _Var2 = __uint32_identity(uVar1);
  ctx[10] = _Var2;
  uVar1 = load32(k + 0x1c);
  _Var2 = __uint32_identity(uVar1);
  ctx[0xb] = _Var2;
  ctx[0xc] = ctr;
  uVar1 = load32(n);
  _Var2 = __uint32_identity(uVar1);
  ctx[0xd] = _Var2;
  uVar1 = load32(n + 4);
  _Var2 = __uint32_identity(uVar1);
  ctx[0xe] = _Var2;
  uVar1 = load32(n + 8);
  _Var2 = __uint32_identity(uVar1);
  ctx[0xf] = _Var2;
  return;
}

Assistant:

void Hacl_Impl_Chacha20_chacha20_init(uint32_t *ctx, uint8_t *k, uint8_t *n, uint32_t ctr)
{
  KRML_MAYBE_FOR4(i,
    0U,
    4U,
    1U,
    uint32_t *os = ctx;
    uint32_t x = chacha20_constants[i];
    os[i] = x;);
  KRML_MAYBE_FOR8(i,
    0U,
    8U,
    1U,
    uint32_t *os = ctx + 4U;
    uint8_t *bj = k + i * 4U;
    uint32_t u = load32_le(bj);
    uint32_t r = u;
    uint32_t x = r;
    os[i] = x;);
  ctx[12U] = ctr;
  KRML_MAYBE_FOR3(i,
    0U,
    3U,
    1U,
    uint32_t *os = ctx + 13U;
    uint8_t *bj = n + i * 4U;
    uint32_t u = load32_le(bj);
    uint32_t r = u;
    uint32_t x = r;
    os[i] = x;);
}